

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O0

void __thiscall Refal2::COperationsExecuter::matchRightBeginSaveToTable_E(COperationsExecuter *this)

{
  COperationsExecuter *this_local;
  
  nextOperation(this);
  saveState(this);
  saveToTable(this,(CUnitNode *)0x0,(CUnitNode *)0x0);
  nextOperation(this);
  return;
}

Assistant:

inline void COperationsExecuter::matchRightBeginSaveToTable_E()
{
	nextOperation();
	saveState();
	saveToTable( 0, 0 );
	nextOperation();
}